

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mtcrf(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *pTVar1;
  uint uVar2;
  TCGv_i32 *ppTVar3;
  long lVar4;
  TCGv_i32 ret;
  int iVar5;
  
  s = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0xc;
  if ((ctx->opcode >> 0x14 & 1) == 0) {
    iVar5 = 0;
    pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)s);
    tcg_gen_extrl_i64_i32_ppc64
              (s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
    ppTVar3 = cpu_crf + 7;
    lVar4 = 0;
    do {
      if ((uVar2 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        tcg_gen_shri_i32_ppc64(s,*ppTVar3,ret,iVar5);
        tcg_gen_andi_i32_ppc64(s,*ppTVar3,*ppTVar3,0xf);
      }
      lVar4 = lVar4 + 1;
      iVar5 = iVar5 + 4;
      ppTVar3 = ppTVar3 + -1;
    } while (lVar4 != 8);
  }
  else {
    uVar2 = uVar2 & 0xff;
    if ((uVar2 ^ uVar2 - 1) <= uVar2 - 1) {
      return;
    }
    pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)s);
    if (uVar2 == 0) {
      iVar5 = 0x20;
    }
    else {
      iVar5 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
    }
    tcg_gen_extrl_i64_i32_ppc64
              (s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
    tcg_gen_shri_i32_ppc64(s,ret,ret,iVar5 * 4);
    tcg_gen_andi_i32_ppc64(s,cpu_crf[7 - iVar5],ret,0xf);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_mtcrf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t crm, crn;

    crm = CRM(ctx->opcode);
    if (likely((ctx->opcode & 0x00100000))) {
        if (crm && ((crm & (crm - 1)) == 0)) {
            TCGv_i32 temp = tcg_temp_new_i32(tcg_ctx);
            crn = ctz32(crm);
            tcg_gen_trunc_tl_i32(tcg_ctx, temp, cpu_gpr[rS(ctx->opcode)]);
            tcg_gen_shri_i32(tcg_ctx, temp, temp, crn * 4);
            tcg_gen_andi_i32(tcg_ctx, cpu_crf[7 - crn], temp, 0xf);
            tcg_temp_free_i32(tcg_ctx, temp);
        }
    } else {
        TCGv_i32 temp = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_trunc_tl_i32(tcg_ctx, temp, cpu_gpr[rS(ctx->opcode)]);
        for (crn = 0 ; crn < 8 ; crn++) {
            if (crm & (1 << crn)) {
                    tcg_gen_shri_i32(tcg_ctx, cpu_crf[7 - crn], temp, crn * 4);
                    tcg_gen_andi_i32(tcg_ctx, cpu_crf[7 - crn], cpu_crf[7 - crn], 0xf);
            }
        }
        tcg_temp_free_i32(tcg_ctx, temp);
    }
}